

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O3

void __thiscall AdsDevice::AdsDevice(AdsDevice *this,string *ipV4,AmsNetId netId,uint16_t port)

{
  long lVar1;
  AmsNetId *pAVar2;
  long *plVar3;
  AdsException *this_00;
  _Any_data _Stack_88;
  code *local_78;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  function<long_(long)> local_48;
  
  lVar1 = bhf::ads::AddLocalRoute(netId,(ipV4->_M_dataplus)._M_p);
  if (lVar1 == 0) {
    pAVar2 = (AmsNetId *)operator_new(6);
    *(int *)pAVar2->b = netId.b._0_4_;
    *(short *)(pAVar2->b + 4) = netId.b._4_2_;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<long_(AmsNetId),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLib/AdsDevice.cpp:21:47)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<long_(AmsNetId),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLib/AdsDevice.cpp:21:47)>
               ::_M_manager;
    std::function<long_(AmsNetId)>::function
              ((function<long_(AmsNetId)> *)&_Stack_88,(function<long_(AmsNetId)> *)&local_68);
    std::function<long_(AmsNetId)>::function
              ((function<long_(AmsNetId)> *)this,(function<long_(AmsNetId)> *)&_Stack_88);
    (this->m_NetId)._M_t.super___uniq_ptr_impl<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>.
    _M_t.super__Tuple_impl<0UL,_const_AmsNetId_*,_ResourceDeleter<const_AmsNetId>_>.
    super__Head_base<0UL,_const_AmsNetId_*,_false>._M_head_impl = pAVar2;
    if (local_78 != (code *)0x0) {
      (*local_78)(&_Stack_88,&_Stack_88,__destroy_functor);
    }
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    *(int *)(this->m_Addr).netId.b = netId.b._0_4_;
    *(short *)((this->m_Addr).netId.b + 4) = netId.b._4_2_;
    (this->m_Addr).port = port;
    plVar3 = (long *)operator_new(8);
    lVar1 = AdsPortOpenEx();
    *plVar3 = lVar1;
    local_48.super__Function_base._M_functor._8_8_ = 0;
    local_48.super__Function_base._M_functor._M_unused._M_function_pointer = AdsPortCloseEx;
    local_48._M_invoker = std::_Function_handler<long_(long),_long_(*)(long)>::_M_invoke;
    local_48.super__Function_base._M_manager =
         std::_Function_handler<long_(long),_long_(*)(long)>::_M_manager;
    std::function<long_(long)>::function((function<long_(long)> *)&_Stack_88,&local_48);
    std::function<long_(long)>::function
              ((function<long_(long)> *)&this->m_LocalPort,(function<long_(long)> *)&_Stack_88);
    (this->m_LocalPort)._M_t.super___uniq_ptr_impl<const_long,_ResourceDeleter<const_long>_>._M_t.
    super__Tuple_impl<0UL,_const_long_*,_ResourceDeleter<const_long>_>.
    super__Head_base<0UL,_const_long_*,_false>._M_head_impl = plVar3;
    if (local_78 != (code *)0x0) {
      (*local_78)(&_Stack_88,&_Stack_88,__destroy_functor);
    }
    if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_48.super__Function_base._M_manager)
                ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
    }
    return;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,lVar1);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

AdsDevice::AdsDevice(const std::string& ipV4, AmsNetId netId, uint16_t port)
    : m_NetId(AddRoute(netId, ipV4.c_str()), {[](AmsNetId ams){bhf::ads::DelLocalRoute(ams); return 0; }}),
    m_Addr({netId, port}),
    m_LocalPort(new long { AdsPortOpenEx() }, {AdsPortCloseEx})
{}